

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.cpp
# Opt level: O0

FILE * SJ_fopen(path *fname,char *mode)

{
  bool bVar1;
  char *__filename;
  string local_40;
  char *local_20;
  char *mode_local;
  path *fname_local;
  
  if ((mode != (char *)0x0) &&
     (local_20 = mode, mode_local = (char *)fname,
     bVar1 = std::filesystem::__cxx11::path::empty(fname), !bVar1)) {
    std::filesystem::__cxx11::path::string(&local_40,(path *)mode_local);
    __filename = (char *)std::__cxx11::string::c_str();
    fname_local = (path *)fopen(__filename,local_20);
    std::__cxx11::string::~string((string *)&local_40);
    return (FILE *)fname_local;
  }
  return (FILE *)0x0;
}

Assistant:

FILE* SJ_fopen(const std::filesystem::path & fname, const char* mode) {
	if (nullptr == mode || fname.empty()) return nullptr;
	return fopen(fname.string().c_str(), mode);
}